

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O2

CURLFORMcode curl_formadd(curl_httppost **httppost,curl_httppost **last_post,...)

{
  char **ppcVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  bool bVar6;
  bool bVar7;
  curl_strdup_callback p_Var8;
  char in_AL;
  int iVar9;
  FormInfo *pFVar10;
  int *piVar11;
  FormInfo *pFVar12;
  long *plVar13;
  curl_slist *pcVar14;
  undefined8 *puVar15;
  size_t sVar16;
  size_t sVar17;
  char *pcVar18;
  curl_httppost *pcVar19;
  curl_httppost *pcVar20;
  uint uVar21;
  undefined8 in_RCX;
  FormInfo *pFVar22;
  ulong uVar23;
  curl_httppost **ppcVar24;
  undefined8 in_RDX;
  long lVar25;
  size_t sVar26;
  char *pcVar27;
  undefined8 in_R8;
  undefined8 in_R9;
  CURLFORMcode CVar28;
  FormInfo *ptr;
  curl_slist *pcVar29;
  int *piVar30;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  ulong local_170;
  va_list arg;
  char *local_150;
  char *local_130;
  long local_e8 [4];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  arg[0].overflow_arg_area = &stack0x00000008;
  uVar21 = 0x10;
  local_e8[2] = in_RDX;
  local_e8[3] = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  pFVar10 = (FormInfo *)(*Curl_ccalloc)(1,0x80);
  if (pFVar10 == (FormInfo *)0x0) {
    return CURL_FORMADD_MEMORY;
  }
  pcVar29 = (curl_slist *)0x0;
  piVar30 = (int *)0x0;
  CVar28 = CURL_FORMADD_OK;
  pFVar22 = pFVar10;
  bVar6 = false;
switchD_00491230_caseD_9:
  pFVar12 = pFVar10;
  if (CVar28 == CURL_FORMADD_OK) {
    if ((bool)(piVar30 != (int *)0x0 & bVar6)) goto code_r0x004911c5;
    uVar23 = (ulong)uVar21;
    if (uVar23 < 0x29) {
      uVar21 = uVar21 + 8;
      piVar11 = (int *)((long)local_e8 + uVar23);
    }
    else {
      piVar11 = (int *)arg[0].overflow_arg_area;
      arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
    }
    iVar9 = *piVar11;
    if (iVar9 != 0x11) goto LAB_0049121c;
    CVar28 = CURL_FORMADD_OK;
    local_130 = (char *)0x0;
    pcVar20 = (curl_httppost *)0x0;
    pFVar22 = pFVar10;
    goto LAB_00491a48;
  }
  for (; pFVar12 != (FormInfo *)0x0; pFVar12 = pFVar12->more) {
    if (pFVar12->name_alloc == true) {
      (*Curl_cfree)(pFVar12->name);
      pFVar12->name = (char *)0x0;
      pFVar12->name_alloc = false;
    }
    if (pFVar12->value_alloc == true) {
      (*Curl_cfree)(pFVar12->value);
      pFVar12->value = (char *)0x0;
      pFVar12->value_alloc = false;
    }
    if (pFVar12->contenttype_alloc == true) {
      (*Curl_cfree)(pFVar12->contenttype);
      pFVar12->contenttype = (char *)0x0;
      pFVar12->contenttype_alloc = false;
    }
    if (pFVar12->showfilename_alloc == true) {
      (*Curl_cfree)(pFVar12->showfilename);
      pFVar12->showfilename = (char *)0x0;
      pFVar12->showfilename_alloc = false;
    }
  }
  goto LAB_00491e16;
code_r0x004911c5:
  iVar9 = *piVar30;
  pcVar29 = *(curl_slist **)(piVar30 + 2);
  piVar30 = piVar30 + 4;
  CVar28 = CURL_FORMADD_OK;
  bVar6 = false;
  if (iVar9 == 0x11) goto switchD_00491230_caseD_9;
  bVar6 = true;
LAB_0049121c:
  CVar28 = CURL_FORMADD_UNKNOWN_OPTION;
  pcVar14 = pcVar29;
  switch(iVar9) {
  case 2:
    *(byte *)&pFVar22->flags = (byte)pFVar22->flags | 4;
  case 1:
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar22->name == (char *)0x0) {
      if (!bVar6) {
        uVar23 = (ulong)uVar21;
        if (uVar23 < 0x29) {
          uVar21 = uVar21 + 8;
          plVar13 = (long *)((long)local_e8 + uVar23);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      CVar28 = CURL_FORMADD_NULL;
      if (pcVar14 != (curl_slist *)0x0) {
        pFVar22->name = (char *)pcVar14;
        CVar28 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00491230_caseD_9;
  case 3:
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar22->namelength == 0) {
      if (!bVar6) {
        uVar23 = (ulong)uVar21;
        if (uVar23 < 0x29) {
          uVar21 = uVar21 + 8;
          plVar13 = (long *)((long)local_e8 + uVar23);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      pFVar22->namelength = (size_t)pcVar14;
      CVar28 = CURL_FORMADD_OK;
    }
    goto switchD_00491230_caseD_9;
  case 5:
    *(byte *)&pFVar22->flags = (byte)pFVar22->flags | 8;
  case 4:
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar22->value != (char *)0x0) goto switchD_00491230_caseD_9;
    if (!bVar6) {
      uVar23 = (ulong)uVar21;
      if (uVar23 < 0x29) {
        uVar21 = uVar21 + 8;
        plVar13 = (long *)((long)local_e8 + uVar23);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar28 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00491230_caseD_9;
    break;
  case 6:
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar22->contentslength == 0) {
      if (!bVar6) {
        uVar23 = (ulong)uVar21;
        if (uVar23 < 0x29) {
          uVar21 = uVar21 + 8;
          plVar13 = (long *)((long)local_e8 + uVar23);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      pFVar22->contentslength = (size_t)pcVar14;
      CVar28 = CURL_FORMADD_OK;
    }
    goto switchD_00491230_caseD_9;
  case 7:
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if ((pFVar22->flags & 10) != 0) goto switchD_00491230_caseD_9;
    if (!bVar6) {
      uVar23 = (ulong)uVar21;
      if (uVar23 < 0x29) {
        uVar21 = uVar21 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar23);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    CVar28 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00491230_caseD_9;
    pcVar18 = (*Curl_cstrdup)((char *)pcVar14);
    pFVar22->value = pcVar18;
    CVar28 = CURL_FORMADD_MEMORY;
    if (pcVar18 == (char *)0x0) goto switchD_00491230_caseD_9;
    *(byte *)&pFVar22->flags = (byte)pFVar22->flags | 2;
    goto LAB_00491979;
  case 8:
    CVar28 = CURL_FORMADD_ILLEGAL_ARRAY;
    bVar7 = !bVar6;
    bVar6 = true;
    if (bVar7) {
      uVar23 = (ulong)uVar21;
      if (uVar23 < 0x29) {
        uVar21 = uVar21 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar23);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      piVar30 = (int *)*puVar15;
      bVar6 = piVar30 != (int *)0x0;
      CVar28 = (uint)(piVar30 == (int *)0x0) * 3;
    }
  default:
    goto switchD_00491230_caseD_9;
  case 10:
    if (!bVar6) {
      uVar23 = (ulong)uVar21;
      if (uVar23 < 0x29) {
        uVar21 = uVar21 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar23);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    if (pFVar22->value != (char *)0x0) {
      CVar28 = CURL_FORMADD_OPTION_TWICE;
      if (((pFVar22->flags & 1) == 0) || (CVar28 = CURL_FORMADD_NULL, pcVar14 == (curl_slist *)0x0))
      goto switchD_00491230_caseD_9;
      pcVar18 = (*Curl_cstrdup)((char *)pcVar14);
      CVar28 = CURL_FORMADD_MEMORY;
      if (pcVar18 == (char *)0x0) goto switchD_00491230_caseD_9;
      pFVar12 = AddFormInfo(pcVar18,(char *)0x0,pFVar22);
      if (pFVar12 == (FormInfo *)0x0) goto LAB_00491985;
      pFVar12->value_alloc = true;
      goto LAB_00491720;
    }
    CVar28 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00491230_caseD_9;
    pcVar18 = (*Curl_cstrdup)((char *)pcVar14);
    pFVar22->value = pcVar18;
    CVar28 = CURL_FORMADD_MEMORY;
    if (pcVar18 == (char *)0x0) goto switchD_00491230_caseD_9;
    *(byte *)&pFVar22->flags = (byte)pFVar22->flags | 1;
LAB_00491979:
    pFVar22->value_alloc = true;
    CVar28 = CURL_FORMADD_OK;
    goto switchD_00491230_caseD_9;
  case 0xb:
  case 0x10:
    if (!bVar6) {
      uVar23 = (ulong)uVar21;
      if (uVar23 < 0x29) {
        uVar21 = uVar21 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar23);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar22->showfilename == (char *)0x0) {
      pcVar18 = (*Curl_cstrdup)((char *)pcVar14);
      pFVar22->showfilename = pcVar18;
      CVar28 = CURL_FORMADD_MEMORY;
      if (pcVar18 != (char *)0x0) {
        pFVar22->showfilename_alloc = true;
        CVar28 = CURL_FORMADD_OK;
      }
    }
    goto switchD_00491230_caseD_9;
  case 0xc:
    *(byte *)&pFVar22->flags = (byte)pFVar22->flags | 0x30;
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar22->buffer != (char *)0x0) goto switchD_00491230_caseD_9;
    if (!bVar6) {
      uVar23 = (ulong)uVar21;
      if (uVar23 < 0x29) {
        uVar21 = uVar21 + 8;
        plVar13 = (long *)((long)local_e8 + uVar23);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar28 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00491230_caseD_9;
    pFVar22->buffer = (char *)pcVar14;
    break;
  case 0xd:
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar22->bufferlength == 0) {
      if (!bVar6) {
        uVar23 = (ulong)uVar21;
        if (uVar23 < 0x29) {
          uVar21 = uVar21 + 8;
          plVar13 = (long *)((long)local_e8 + uVar23);
        }
        else {
          plVar13 = (long *)arg[0].overflow_arg_area;
          arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
        }
        pcVar14 = (curl_slist *)*plVar13;
      }
      pFVar22->bufferlength = (size_t)pcVar14;
      CVar28 = CURL_FORMADD_OK;
    }
    goto switchD_00491230_caseD_9;
  case 0xe:
    if (!bVar6) {
      uVar23 = (ulong)uVar21;
      if (uVar23 < 0x29) {
        uVar21 = uVar21 + 8;
        puVar15 = (undefined8 *)((long)local_e8 + uVar23);
      }
      else {
        puVar15 = (undefined8 *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*puVar15;
    }
    if (pFVar22->contenttype == (char *)0x0) {
      CVar28 = CURL_FORMADD_NULL;
      if (pcVar14 != (curl_slist *)0x0) {
        pcVar18 = (*Curl_cstrdup)((char *)pcVar14);
        pFVar22->contenttype = pcVar18;
        CVar28 = CURL_FORMADD_MEMORY;
        if (pcVar18 != (char *)0x0) {
          pFVar22->contenttype_alloc = true;
          CVar28 = CURL_FORMADD_OK;
        }
      }
      goto switchD_00491230_caseD_9;
    }
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (((pFVar22->flags & 1) == 0) || (CVar28 = CURL_FORMADD_NULL, pcVar14 == (curl_slist *)0x0))
    goto switchD_00491230_caseD_9;
    pcVar18 = (*Curl_cstrdup)((char *)pcVar14);
    CVar28 = CURL_FORMADD_MEMORY;
    if (pcVar18 == (char *)0x0) goto switchD_00491230_caseD_9;
    pFVar12 = AddFormInfo((char *)0x0,pcVar18,pFVar22);
    if (pFVar12 == (FormInfo *)0x0) {
LAB_00491985:
      (*Curl_cfree)(pcVar18);
      CVar28 = CURL_FORMADD_MEMORY;
      goto switchD_00491230_caseD_9;
    }
    pFVar12->contenttype_alloc = true;
LAB_00491720:
    CVar28 = CURL_FORMADD_OK;
    pFVar22 = pFVar12;
    goto switchD_00491230_caseD_9;
  case 0xf:
    if (!bVar6) {
      uVar23 = (ulong)uVar21;
      if (uVar23 < 0x29) {
        uVar21 = uVar21 + 8;
        plVar13 = (long *)((long)local_e8 + uVar23);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar22->contentheader == (curl_slist *)0x0) {
      pFVar22->contentheader = pcVar14;
      CVar28 = CURL_FORMADD_OK;
    }
    goto switchD_00491230_caseD_9;
  case 0x13:
    *(byte *)&pFVar22->flags = (byte)pFVar22->flags | 0x40;
    CVar28 = CURL_FORMADD_OPTION_TWICE;
    if (pFVar22->userp != (char *)0x0) goto switchD_00491230_caseD_9;
    if (!bVar6) {
      uVar23 = (ulong)uVar21;
      if (uVar23 < 0x29) {
        uVar21 = uVar21 + 8;
        plVar13 = (long *)((long)local_e8 + uVar23);
      }
      else {
        plVar13 = (long *)arg[0].overflow_arg_area;
        arg[0].overflow_arg_area = (void *)((long)arg[0].overflow_arg_area + 8);
      }
      pcVar14 = (curl_slist *)*plVar13;
    }
    CVar28 = CURL_FORMADD_NULL;
    if (pcVar14 == (curl_slist *)0x0) goto switchD_00491230_caseD_9;
    pFVar22->userp = (char *)pcVar14;
  }
  pFVar22->value = (char *)pcVar14;
  CVar28 = CURL_FORMADD_OK;
  goto switchD_00491230_caseD_9;
LAB_00491a48:
  p_Var8 = Curl_cstrdup;
  if (pFVar22 != (FormInfo *)0x0) {
    if (pFVar22->name == (char *)0x0) {
      if (pcVar20 == (curl_httppost *)0x0) goto LAB_00491d8e;
LAB_00491a6e:
      local_170 = pFVar22->flags;
      if (((((pFVar22->contentslength != 0 & (byte)local_170) != 0) ||
           (uVar21 = (uint)local_170, (uVar21 & 9) == 9)) || ((~uVar21 & 10) == 0)) ||
         ((~uVar21 & 0x30) == 0 && pFVar22->buffer == (char *)0x0)) goto LAB_00491d8e;
      if (((local_170 & 0x11) != 0) && (pFVar22->contenttype == (char *)0x0)) {
        pcVar18 = *(char **)((long)&pFVar22->value + (ulong)(uVar21 & 0x10) * 4);
        pcVar27 = local_130;
        if (local_130 == (char *)0x0) {
          pcVar27 = "application/octet-stream";
        }
        if (pcVar18 != (char *)0x0) {
          for (lVar25 = 8; lVar25 != 0x68; lVar25 = lVar25 + 0x10) {
            sVar16 = strlen(pcVar18);
            pcVar2 = *(char **)(&UNK_005df9a8 + lVar25);
            sVar17 = strlen(pcVar2);
            if ((sVar17 <= sVar16) &&
               (iVar9 = curl_strequal(pcVar18 + (sVar16 - sVar17),pcVar2), iVar9 != 0)) {
              pcVar27 = *(char **)((long)&ContentTypeForFilename_ctts + lVar25);
              break;
            }
          }
        }
        pcVar18 = (*p_Var8)(pcVar27);
        pFVar22->contenttype = pcVar18;
        if (pcVar18 != (char *)0x0) {
          pFVar22->contenttype_alloc = true;
          local_170 = pFVar22->flags;
          goto LAB_00491b89;
        }
LAB_00491d93:
        CVar28 = CURL_FORMADD_MEMORY;
        goto LAB_00491dfe;
      }
LAB_00491b89:
      if (pFVar22 == pFVar10 && (local_170 & 4) == 0) {
        pcVar18 = pFVar22->name;
        if (pcVar18 != (char *)0x0) {
          sVar26 = pFVar22->namelength;
          if (sVar26 == 0) {
            sVar16 = strlen(pcVar18);
            sVar26 = sVar16 + 1;
          }
          pcVar18 = Curl_memdup(pcVar18,sVar26);
          pFVar22->name = pcVar18;
          if (pcVar18 != (char *)0x0) {
            pFVar22->name_alloc = true;
            local_170 = pFVar22->flags;
            goto LAB_00491bd9;
          }
        }
        goto LAB_00491d93;
      }
LAB_00491bd9:
      local_150 = pFVar22->value;
      if ((local_170 & 0x6b) == 0) {
        if (local_150 == (char *)0x0) {
          local_150 = (char *)0x0;
        }
        else {
          sVar26 = pFVar22->contentslength;
          if (sVar26 == 0) {
            sVar16 = strlen(local_150);
            sVar26 = sVar16 + 1;
          }
          local_150 = Curl_memdup(local_150,sVar26);
          pFVar22->value = local_150;
          if (local_150 == (char *)0x0) goto LAB_00491d93;
          pFVar22->value_alloc = true;
          local_170 = pFVar22->flags;
        }
      }
      pcVar18 = pFVar22->name;
      sVar16 = pFVar22->namelength;
      sVar26 = pFVar22->contentslength;
      pcVar27 = pFVar22->buffer;
      sVar3 = pFVar22->bufferlength;
      pcVar2 = pFVar22->contenttype;
      pcVar29 = pFVar22->contentheader;
      pcVar4 = pFVar22->showfilename;
      pcVar5 = pFVar22->userp;
      pcVar19 = (curl_httppost *)(*Curl_ccalloc)(1,0x68);
      if (pcVar19 == (curl_httppost *)0x0) goto LAB_00491d93;
      pcVar19->name = pcVar18;
      if (pcVar18 == (char *)0x0) {
        sVar16 = 0;
      }
      else if (sVar16 == 0) {
        sVar16 = strlen(pcVar18);
      }
      pcVar19->namelength = sVar16;
      pcVar19->contents = local_150;
      pcVar19->contentslength = sVar26;
      pcVar19->buffer = pcVar27;
      pcVar19->bufferlength = sVar3;
      pcVar19->contenttype = pcVar2;
      pcVar19->contentheader = pcVar29;
      pcVar19->showfilename = pcVar4;
      pcVar19->userp = pcVar5;
      pcVar19->flags = local_170;
      if (pcVar20 == (curl_httppost *)0x0) {
        pcVar20 = *last_post;
        if (*last_post == (curl_httppost *)0x0) {
          pcVar20 = (curl_httppost *)httppost;
        }
        pcVar20->next = pcVar19;
        ppcVar24 = last_post;
      }
      else {
        pcVar19->more = pcVar20->more;
        ppcVar24 = &pcVar20->more;
      }
      *ppcVar24 = pcVar19;
      ppcVar1 = &pFVar22->contenttype;
      pFVar22 = pFVar22->more;
      pcVar20 = pcVar19;
      if (*ppcVar1 != (char *)0x0) {
        local_130 = *ppcVar1;
      }
      goto LAB_00491a48;
    }
    if (pFVar22->value != (char *)0x0 || pcVar20 != (curl_httppost *)0x0) goto LAB_00491a6e;
LAB_00491d8e:
    CVar28 = CURL_FORMADD_INCOMPLETE;
LAB_00491dfe:
    for (; pFVar22 != (FormInfo *)0x0; pFVar22 = pFVar22->more) {
      if (pFVar22->name_alloc == true) {
        (*Curl_cfree)(pFVar22->name);
        pFVar22->name = (char *)0x0;
        pFVar22->name_alloc = false;
      }
      if (pFVar22->value_alloc == true) {
        (*Curl_cfree)(pFVar22->value);
        pFVar22->value = (char *)0x0;
        pFVar22->value_alloc = false;
      }
      if (pFVar22->contenttype_alloc == true) {
        (*Curl_cfree)(pFVar22->contenttype);
        pFVar22->contenttype = (char *)0x0;
        pFVar22->contenttype_alloc = false;
      }
      if (pFVar22->showfilename_alloc == true) {
        (*Curl_cfree)(pFVar22->showfilename);
        pFVar22->showfilename = (char *)0x0;
        pFVar22->showfilename_alloc = false;
      }
    }
  }
LAB_00491e16:
  while (pFVar10 != (FormInfo *)0x0) {
    pFVar22 = pFVar10->more;
    (*Curl_cfree)(pFVar10);
    pFVar10 = pFVar22;
  }
  return CVar28;
}

Assistant:

CURLFORMcode curl_formadd(struct curl_httppost **httppost,
                          struct curl_httppost **last_post,
                          ...)
{
  va_list arg;
  CURLFORMcode result;
  va_start(arg, last_post);
  result = FormAdd(httppost, last_post, arg);
  va_end(arg);
  return result;
}